

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_init_file_v2
                  (mz_zip_archive *pZip,char *pFilename,mz_uint64 size_to_reserve_at_beginning,
                  mz_uint flags)

{
  mz_bool mVar1;
  ulong uVar2;
  uint in_ECX;
  ulong in_RDX;
  char *in_RSI;
  char *__modes;
  long in_RDI;
  size_t n;
  char buf [4096];
  mz_uint64 cur_ofs;
  FILE *pFile;
  mz_uint64 in_stack_ffffffffffffef98;
  ulong uVar3;
  mz_zip_archive *in_stack_ffffffffffffefa0;
  undefined1 local_1058 [4104];
  long local_50;
  FILE *local_48;
  uint local_3c;
  ulong local_38;
  char *local_30;
  long local_28;
  mz_bool local_20;
  
  *(code **)(in_RDI + 0x50) = mz_zip_file_write_func;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  if ((in_ECX & 0x8000) != 0) {
    *(code **)(in_RDI + 0x48) = mz_zip_file_read_func;
  }
  *(long *)(in_RDI + 0x60) = in_RDI;
  local_3c = in_ECX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  mVar1 = mz_zip_writer_init_v2(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,0);
  if (mVar1 == 0) {
    local_20 = 0;
  }
  else {
    __modes = "wb";
    if ((local_3c & 0x8000) != 0) {
      __modes = "w+b";
    }
    local_48 = fopen64(local_30,__modes);
    if (local_48 == (FILE *)0x0) {
      mz_zip_writer_end((mz_zip_archive *)0x12a4b0);
      if (local_28 != 0) {
        *(undefined4 *)(local_28 + 0x1c) = 0x11;
      }
      local_20 = 0;
    }
    else {
      *(FILE **)(*(long *)(local_28 + 0x68) + 0x70) = local_48;
      *(undefined4 *)(local_28 + 0x18) = 4;
      if (local_38 != 0) {
        local_50 = 0;
        memset(local_1058,0,0x1000);
        do {
          uVar3 = local_38;
          if (0x1000 < local_38) {
            uVar3 = 0x1000;
          }
          uVar2 = (**(code **)(local_28 + 0x50))
                            (*(undefined8 *)(local_28 + 0x60),local_50,local_1058,uVar3);
          if (uVar2 != uVar3) {
            mz_zip_writer_end((mz_zip_archive *)0x12a5ba);
            if (local_28 != 0) {
              *(undefined4 *)(local_28 + 0x1c) = 0x13;
            }
            return 0;
          }
          local_50 = uVar3 + local_50;
          local_38 = local_38 - uVar3;
        } while (local_38 != 0);
      }
      local_20 = 1;
    }
  }
  return local_20;
}

Assistant:

inline mz_bool
mz_zip_writer_init_file_v2(mz_zip_archive* pZip, const char* pFilename, mz_uint64 size_to_reserve_at_beginning,
                           mz_uint flags) {

    MZ_FILE* pFile;

    pZip->m_pWrite = mz_zip_file_write_func;
    pZip->m_pNeeds_keepalive = NULL;

    if (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING)
        pZip->m_pRead = mz_zip_file_read_func;

    pZip->m_pIO_opaque = pZip;

    if (!mz_zip_writer_init_v2(pZip, size_to_reserve_at_beginning, flags))
        return MZ_FALSE;

    if (NULL == (pFile = MZ_FOPEN(pFilename, (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING) ? "w+b" : "wb"))) {
        mz_zip_writer_end(pZip);
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);
    }

    pZip->m_pState->m_pFile = pFile;
    pZip->m_zip_type = MZ_ZIP_TYPE_FILE;

    if (size_to_reserve_at_beginning) {
        mz_uint64 cur_ofs = 0;
        char buf[4096];

        MZ_CLEAR_OBJ(buf);

        do {
            size_t n = (size_t)MZ_MIN(sizeof(buf), size_to_reserve_at_beginning);
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_ofs, buf, n) != n) {
                mz_zip_writer_end(pZip);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
            }
            cur_ofs += n;
            size_to_reserve_at_beginning -= n;
        } while (size_to_reserve_at_beginning);
    }

    return MZ_TRUE;
}